

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mouse.cpp
# Opt level: O1

void __thiscall Mouse::OnWheelDown(Mouse *this,int x,int y)

{
  Event local_18;
  
  local_18.type = WheelDown;
  local_18.leftIsPressed = this->leftIsPressed;
  local_18.rightIsPressed = this->rightIsPressed;
  local_18.x = this->x;
  local_18.y = this->y;
  std::deque<Mouse::Event,_std::allocator<Mouse::Event>_>::emplace_back<Mouse::Event>
            (&(this->buffer).c,&local_18);
  TrimBuffer(this);
  return;
}

Assistant:

void Mouse::OnWheelDown( int x,int y )
{
	buffer.push( Mouse::Event( Mouse::Event::Type::WheelDown,*this ) );
	TrimBuffer();
}